

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_BanDatabase.cpp
# Opt level: O1

void __thiscall RenX::BanDatabase::process_file_finish(BanDatabase *this,FILE *file)

{
  pointer puVar1;
  FILE *pFVar2;
  size_t in_RCX;
  unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_> *entry;
  pointer puVar3;
  
  if (2 < this->m_read_version) {
    if (this->m_read_version < this->m_write_version) {
      pFVar2 = freopen((this->m_filename)._M_dataplus._M_p,"wb",(FILE *)file);
      if (pFVar2 != (FILE *)0x0) {
        (**(code **)(*(long *)this + 0x10))(this,file);
        puVar1 = (this->m_entries).
                 super__Vector_base<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>,_std::allocator<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (puVar3 = (this->m_entries).
                      super__Vector_base<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>,_std::allocator<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; puVar3 != puVar1;
            puVar3 = puVar3 + 1) {
          write(this,(int)(puVar3->_M_t).
                          super___uniq_ptr_impl<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
                          .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl,
                file,in_RCX);
        }
      }
    }
    fgetpos((FILE *)file,(fpos_t *)&this->m_eof);
    return;
  }
  pFVar2 = freopen((this->m_filename)._M_dataplus._M_p,"wb",(FILE *)file);
  if (pFVar2 != (FILE *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "Warning: Unsupported ban database file version. The database will be removed and rewritten."
               ,0x5b);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
    std::ostream::put(-0x50);
    std::ostream::flush();
    (**(code **)(*(long *)this + 0x10))(this,file);
    fgetpos((FILE *)file,(fpos_t *)&this->m_eof);
    this->m_read_version = this->m_write_version;
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "FATAL ERROR: UNABLE TO REMOVE UNSUPPORTED BAN DATABASE FILE VERSION",0x43);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  std::ostream::flush();
  return;
}

Assistant:

void RenX::BanDatabase::process_file_finish(FILE *file) {
	if (m_read_version < 3) {
		if (freopen(m_filename.c_str(), "wb", file) == nullptr) {
			std::cout << "FATAL ERROR: UNABLE TO REMOVE UNSUPPORTED BAN DATABASE FILE VERSION" << std::endl;
			return;
		}

		std::cout << "Warning: Unsupported ban database file version. The database will be removed and rewritten." << std::endl;
		create_header(file);
		fgetpos(file, std::addressof(m_eof));
		m_read_version = m_write_version;
		return;
	}
	else if (m_read_version < m_write_version) {
		if (freopen(m_filename.c_str(), "wb", file) != nullptr) {
			this->create_header(file);
			for (const auto& entry : m_entries) {
				write(entry.get(), file);
			}
		}
	}

	fgetpos(file, std::addressof(m_eof));
}